

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall QPlainTextEdit::paintEvent(QPlainTextEdit *this,QPaintEvent *e)

{
  undefined1 (*pauVar1) [16];
  QWidgetData *pQVar2;
  QArrayData *pQVar3;
  int *piVar4;
  undefined1 *puVar5;
  Selection *pSVar6;
  undefined8 uVar7;
  char cVar8;
  bool bVar9;
  TextInteractionFlags TVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Representation RVar14;
  undefined4 uVar15;
  TextInteractionFlags TVar16;
  QWidget *pQVar17;
  long *plVar18;
  QPainter *pQVar19;
  QBrush *pQVar20;
  QScrollBar *pQVar21;
  QPalette *pQVar22;
  int iVar23;
  long lVar24;
  undefined1 *extraout_RDX;
  int iVar25;
  ulong uVar26;
  QPaintDevice *pQVar27;
  undefined8 *puVar28;
  BrushStyle BVar29;
  PaintContext *pPVar30;
  QTextFormat *pQVar31;
  long in_FS_OFFSET;
  byte bVar32;
  undefined1 *puVar33;
  undefined1 *puVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  QPointF QVar38;
  QBrush bg;
  QPainter painter;
  PaintContext context;
  long local_148;
  undefined1 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  qreal local_128;
  double local_120;
  undefined1 local_110 [8];
  undefined8 local_108;
  undefined1 *puStack_100;
  undefined1 *local_f8;
  QRectF local_e8;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 local_b8 [24];
  double local_a0;
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection> local_80;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  undefined8 uStack_50;
  undefined8 local_48;
  double local_40;
  long local_38;
  
  bVar32 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar24 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  local_110 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  pQVar17 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  pQVar27 = &pQVar17->super_QPaintDevice;
  if (pQVar17 == (QWidget *)0x0) {
    pQVar27 = (QPaintDevice *)0x0;
  }
  QPainter::QPainter((QPainter *)local_110,pQVar27);
  QVar38 = contentOffset(this);
  local_128 = QVar38.xp;
  local_120 = QVar38.yp;
  local_138 = *(undefined8 *)(e + 0x10);
  uStack_130 = *(undefined8 *)(e + 0x18);
  pQVar17 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  pQVar2 = pQVar17->data;
  iVar25 = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
  iVar23 = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
  TVar10 = QWidgetTextControl::textInteractionFlags
                     (*(QWidgetTextControl **)
                       (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                                  field_0x8 + 800));
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::document
            (*(QWidgetTextControl **)
              (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
              800));
  QTextDocument::findBlockByNumber((int)local_68);
  QWidgetTextControl::document
            (*(QWidgetTextControl **)
              (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
              800));
  plVar18 = (long *)QTextDocument::documentLayout();
  puVar33 = (undefined1 *)(**(code **)(*plVar18 + 0x78))(plVar18);
  QPainter::setBrushOrigin((QPointF *)local_110);
  puVar34 = (undefined1 *)(double)(iVar25 + 1);
  puVar5 = puVar33;
  if ((double)puVar33 <= (double)puVar34) {
    puVar5 = puVar34;
  }
  dVar36 = (double)puVar5 + local_128;
  QWidgetTextControl::document
            (*(QWidgetTextControl **)
              (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
              800));
  dVar35 = (double)QTextDocument::documentMargin();
  iVar11 = QWidgetTextControl::cursorWidth
                     (*(QWidgetTextControl **)
                       (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                                  field_0x8 + 800));
  iVar11 = (int)((double)iVar11 + (dVar36 - dVar35));
  if ((int)uStack_130 < iVar11) {
    iVar11 = (int)uStack_130;
  }
  uStack_130 = CONCAT44(uStack_130._4_4_,iVar11);
  QPainter::setClipRect((QRect *)local_110,(ClipOperation)&local_138);
  lVar24 = *(long *)(lVar24 + 8);
  QWidgetTextControl::document(*(QWidgetTextControl **)(*(long *)(lVar24 + 8) + 800));
  cVar8 = QTextDocument::isEmpty();
  if (cVar8 != '\0') {
    lVar24 = *(long *)(lVar24 + 8);
    pQVar3 = *(QArrayData **)(lVar24 + 0x308);
    lVar24 = *(long *)(lVar24 + 0x318);
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    if (lVar24 != 0) {
      QWidgetTextControl::palette((QWidgetTextControl *)local_b8);
      plVar18 = (long *)QPalette::brush((ColorGroup)(QPalette *)local_b8,Dark);
      local_e8.xp = *(qreal *)(*plVar18 + 8);
      local_e8.yp = *(qreal *)(*plVar18 + 0x10);
      QPalette::~QPalette((QPalette *)local_b8);
      QPainter::setPen((QColor *)local_110);
      QPainter::setClipRect((QRect *)local_110,(int)e + 0x10);
      QWidgetTextControl::document
                (*(QWidgetTextControl **)
                  (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8
                  + 800));
      dVar36 = (double)QTextDocument::documentMargin();
      local_b8._0_8_ = (undefined8)(int)dVar36;
      local_b8._16_8_ = (undefined8)(((long)iVar25 - (long)(int)dVar36) + 1);
      local_a0 = (double)(((long)iVar23 - (long)(int)dVar36) + 1);
      lVar24 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
      pauVar1 = (undefined1 (*) [16])(lVar24 + 0x308);
      piVar4 = *(int **)*pauVar1;
      _local_58 = *pauVar1;
      local_48 = *(undefined8 *)(lVar24 + 0x318);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      local_b8._8_8_ = local_b8._0_8_;
      QPainter::drawText((QRectF *)local_110,(int)local_b8,(QString *)0x1020,(QRectF *)local_58);
      if (local_58 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)local_58 = *(int *)local_58 + -1;
        UNLOCK();
        if (*(int *)local_58 == 0) {
          QArrayData::deallocate((QArrayData *)local_58,2,0x10);
        }
      }
    }
  }
  puVar28 = &DAT_006df1b0;
  pPVar30 = (PaintContext *)local_b8;
  for (lVar24 = 10; lVar24 != 0; lVar24 = lVar24 + -1) {
    *(undefined8 *)pPVar30 = *puVar28;
    puVar28 = puVar28 + (ulong)bVar32 * -2 + 1;
    pPVar30 = (PaintContext *)((long)pPVar30 + (ulong)bVar32 * -0x10 + 8);
  }
  lVar24 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  QWidgetTextControl::getPaintContext
            ((PaintContext *)local_b8,*(QWidgetTextControl **)(lVar24 + 800),
             *(QWidget **)(lVar24 + 0x2b0));
  QPalette::brush((int)local_b8 + 8,Dark);
  QPainter::setPen((QColor *)local_110);
  cVar8 = QTextBlock::isValid();
  if (cVar8 != '\0') {
    do {
      blockBoundingRect((QRectF *)local_58,this,(QTextBlock *)local_68);
      dVar36 = local_40;
      uVar7 = local_48;
      dVar35 = (double)local_58 + local_128;
      dVar37 = (double)uStack_50 + local_120;
      pQVar19 = (QPainter *)QTextBlock::layout();
      cVar8 = QTextBlock::isVisible();
      if (cVar8 == '\0') {
        local_120 = dVar36 + local_120;
      }
      else {
        if (((double)local_138._4_4_ <= dVar37 + dVar36) && (dVar37 <= (double)uStack_130._4_4_)) {
          local_c8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
          QTextBlock::blockFormat();
          local_140 = &DAT_aaaaaaaaaaaaaaaa;
          BVar29 = (BrushStyle)(QBrush *)&local_140;
          QTextFormat::brushProperty(BVar29);
          cVar8 = QBrush::doCompareEqualStyle(BVar29);
          if (cVar8 == '\0') {
            uStack_50 = dVar37;
            local_58 = (undefined1  [8])dVar35;
            local_48 = puVar33;
            if ((double)puVar33 <= (double)uVar7) {
              local_48 = uVar7;
            }
            local_40 = dVar36;
            QBrush::QBrush((QBrush *)&local_148,(QBrush *)&local_140);
            QPainter::save();
            if (2 < *(int *)(local_148 + 4) - 0xfU) {
              local_e8.xp = (qreal)local_58;
              local_e8.yp = (qreal)uStack_50;
              QPainter::setBrushOrigin((QPointF *)local_110);
            }
            QPainter::fillRect((QRectF *)local_110,(QBrush *)local_58);
            QPainter::restore();
            QBrush::~QBrush((QBrush *)&local_148);
          }
          local_e8.xp = 0.0;
          local_e8.yp = 0.0;
          local_e8.w = 0.0;
          iVar25 = QTextBlock::position();
          iVar11 = QTextBlock::length();
          if (local_80.size != 0) {
            lVar24 = 0;
            uVar26 = 0;
            do {
              pSVar6 = local_80.ptr;
              iVar12 = QTextCursor::selectionStart();
              iVar13 = QTextCursor::selectionEnd();
              if (((iVar12 < iVar13) && (iVar12 = iVar12 - iVar25, iVar12 < iVar11)) &&
                 (0 < iVar13 - iVar25)) {
                local_48 = &DAT_aaaaaaaaaaaaaaaa;
                local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
                uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
                QTextCharFormat::QTextCharFormat((QTextCharFormat *)(local_58 + 8));
                local_58._4_4_ = (iVar13 - iVar25) - iVar12;
                local_58._0_4_ = iVar12;
                QTextFormat::operator=
                          ((QTextFormat *)(local_58 + 8),
                           &(pSVar6->format).super_QTextFormat + lVar24);
                QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
                emplace<QTextLayout::FormatRange_const&>
                          ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_e8,
                           (qsizetype)local_e8.w,(FormatRange *)local_58);
                QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_e8);
LAB_0049956e:
                QTextFormat::~QTextFormat((QTextFormat *)(local_58 + 8));
              }
              else {
                cVar8 = QTextCursor::hasSelection();
                if (cVar8 == '\0') {
                  pQVar31 = &(pSVar6->format).super_QTextFormat + lVar24;
                  cVar8 = QTextFormat::hasProperty((int)pQVar31);
                  if (cVar8 != '\0') {
                    QTextCursor::position();
                    cVar8 = QTextBlock::contains((int)local_68);
                    if (cVar8 != '\0') {
                      local_48 = &DAT_aaaaaaaaaaaaaaaa;
                      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
                      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
                      QTextCharFormat::QTextCharFormat((QTextCharFormat *)(local_58 + 8));
                      local_108 = &DAT_aaaaaaaaaaaaaaaa;
                      puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
                      QTextCursor::position();
                      RVar14.m_i = QTextLayout::lineForTextPosition((int)pQVar19);
                      local_108 = (undefined1 *)CONCAT44(local_108._4_4_,RVar14.m_i);
                      puStack_100 = extraout_RDX;
                      uVar15 = QTextLine::textStart();
                      local_58._0_4_ = uVar15;
                      iVar12 = QTextLine::textLength();
                      if (local_58._0_4_ + iVar12 == iVar11 + -1) {
                        iVar12 = iVar12 + 1;
                      }
                      local_58._4_4_ = iVar12;
                      QTextFormat::operator=((QTextFormat *)(local_58 + 8),pQVar31);
                      QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
                      emplace<QTextLayout::FormatRange_const&>
                                ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_e8,
                                 (qsizetype)local_e8.w,(FormatRange *)local_58);
                      QList<QTextLayout::FormatRange>::end
                                ((QList<QTextLayout::FormatRange> *)&local_e8);
                      goto LAB_0049956e;
                    }
                  }
                }
              }
              uVar26 = uVar26 + 1;
              lVar24 = lVar24 + 0x18;
            } while (uVar26 < (ulong)local_80.size);
          }
          if (((uint)TVar10.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                     super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) == 0) {
            TVar16 = QWidgetTextControl::textInteractionFlags
                               (*(QWidgetTextControl **)
                                 (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.
                                            super_QWidget.field_0x8 + 800));
            bVar9 = true;
            if (((uint)TVar16.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                       super_QFlagsStorage<Qt::TextInteractionFlag>.i & 2) != 0) goto LAB_004996ff;
          }
          else {
LAB_004996ff:
            bVar9 = true;
            if ((int)local_b8._0_4_ < iVar25 + iVar11 && iVar25 <= (int)local_b8._0_4_) {
              bVar9 = QWidgetTextControl::overwriteMode
                                (*(QWidgetTextControl **)
                                  (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.
                                             super_QWidget.field_0x8 + 800));
              if (bVar9) {
                bVar9 = local_b8._0_4_ != iVar11 + iVar25 + -1;
                if (bVar9) {
                  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
                  local_108 = &DAT_aaaaaaaaaaaaaaaa;
                  puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
                  QTextCharFormat::QTextCharFormat((QTextCharFormat *)&puStack_100);
                  local_108 = (undefined1 *)CONCAT44(1,local_b8._0_4_ - iVar25);
                  pQVar22 = QWidget::palette((QWidget *)this);
                  pQVar20 = (QBrush *)QPalette::brush((ColorGroup)pQVar22,Dark);
                  QBrush::operator_cast_to_QVariant((QVariant *)local_58,pQVar20);
                  iVar11 = (int)(QTextFormat *)&puStack_100;
                  QTextFormat::setProperty(iVar11,(QVariant *)0x821);
                  ::QVariant::~QVariant((QVariant *)local_58);
                  pQVar22 = QWidget::palette((QWidget *)this);
                  pQVar20 = (QBrush *)QPalette::brush((ColorGroup)pQVar22,Dark);
                  QBrush::operator_cast_to_QVariant((QVariant *)local_58,pQVar20);
                  QTextFormat::setProperty(iVar11,(QVariant *)0x820);
                  ::QVariant::~QVariant((QVariant *)local_58);
                  QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
                  emplace<QTextLayout::FormatRange_const&>
                            ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_e8,
                             (qsizetype)local_e8.w,(FormatRange *)&local_108);
                  QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_e8)
                  ;
                  QTextFormat::~QTextFormat((QTextFormat *)&puStack_100);
                }
              }
              else {
                bVar9 = false;
              }
            }
          }
          iVar11 = (int)((ulong)local_138 >> 0x20);
          dVar35 = (double)iVar11;
          uStack_50._0_4_ = SUB84(dVar35,0);
          local_58 = (undefined1  [8])(double)(int)local_138;
          uStack_50._4_4_ = (int)((ulong)dVar35 >> 0x20);
          local_48 = (undefined8)(((long)(int)uStack_130 - (long)(int)local_138) + 1);
          local_40 = (double)(((long)uStack_130._4_4_ - (long)iVar11) + 1);
          QTextLayout::draw(pQVar19,(QPointF *)local_110,(QList_conflict *)&local_128,&local_e8);
          if (bVar9) {
            if ((((uint)TVar10.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                        super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) != 0) &&
               ((int)local_b8._0_4_ < -1)) {
              QTextLayout::preeditAreaText();
              uVar7 = local_48;
              if (local_58 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)local_58 = *(int *)local_58 + -1;
                UNLOCK();
                if (*(int *)local_58 == 0) {
                  QArrayData::deallocate((QArrayData *)local_58,2,0x10);
                }
              }
              if ((undefined1 *)uVar7 != (undefined1 *)0x0) goto LAB_00499961;
            }
          }
          else {
LAB_00499961:
            uVar15 = local_b8._0_4_;
            if ((int)local_b8._0_4_ < -1) {
              iVar25 = QTextLayout::preeditAreaPosition();
              iVar25 = (iVar25 - uVar15) + -2;
            }
            else {
              iVar25 = local_b8._0_4_ - iVar25;
            }
            QWidgetTextControl::cursorWidth
                      (*(QWidgetTextControl **)
                        (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                                   field_0x8 + 800));
            QTextLayout::drawCursor(pQVar19,(QPointF *)local_110,(int)&local_128,iVar25);
          }
          QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
                    ((QArrayDataPointer<QTextLayout::FormatRange> *)&local_e8);
          QBrush::~QBrush((QBrush *)&local_140);
          QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
        }
        local_120 = dVar36 + local_120;
        if ((double)(iVar23 + 1) < local_120) break;
      }
      QTextBlock::next();
      local_68._0_8_ = local_58;
      local_68._8_4_ = (undefined4)uStack_50;
      cVar8 = QTextBlock::isValid();
    } while (cVar8 != '\0');
  }
  if ((((*(byte *)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8
                  + 0x348) & 4) != 0) && (cVar8 = QTextBlock::isValid(), cVar8 == '\0')) &&
     (local_120 <= (double)uStack_130._4_4_)) {
    if ((*(byte *)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8
                  + 0x348) & 8) == 0) {
      pQVar21 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar23 = QAbstractSlider::maximum(&pQVar21->super_QAbstractSlider);
      pQVar21 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar25 = QAbstractSlider::minimum(&pQVar21->super_QAbstractSlider);
      if (iVar23 != iVar25) goto LAB_00499b04;
    }
    local_58._4_4_ = (int)local_120;
    local_58._0_4_ = (undefined4)local_138;
    uStack_50._0_4_ = (int)uStack_130;
    uStack_50._4_4_ = (int)((ulong)uStack_130 >> 0x20);
    pQVar22 = QWidget::palette((QWidget *)this);
    QPalette::brush((ColorGroup)pQVar22,Dark);
    QPainter::fillRect((QRect *)local_110,(QBrush *)local_58);
  }
LAB_00499b04:
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::~QArrayDataPointer(&local_80);
  QPalette::~QPalette((QPalette *)(local_b8 + 8));
  QPainter::~QPainter((QPainter *)local_110);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEdit::paintEvent(QPaintEvent *e)
{
    Q_D(QPlainTextEdit);
    QPainter painter(viewport());
    Q_ASSERT(qobject_cast<QPlainTextDocumentLayout*>(document()->documentLayout()));

    QPointF offset(contentOffset());

    QRect er = e->rect();
    QRect viewportRect = viewport()->rect();

    bool editable = !isReadOnly();

    QTextBlock block = firstVisibleBlock();
    qreal maximumWidth = document()->documentLayout()->documentSize().width();

    // Set a brush origin so that the WaveUnderline knows where the wave started
    painter.setBrushOrigin(offset);

    // keep right margin clean from full-width selection
    int maxX = offset.x() + qMax((qreal)viewportRect.width(), maximumWidth)
               - document()->documentMargin() + cursorWidth();
    er.setRight(qMin(er.right(), maxX));
    painter.setClipRect(er);

    if (d->placeHolderTextToBeShown()) {
        const QColor col = d->control->palette().placeholderText().color();
        painter.setPen(col);
        painter.setClipRect(e->rect());
        const int margin = int(document()->documentMargin());
        QRectF textRect = viewportRect.adjusted(margin, margin, 0, 0);
        painter.drawText(textRect, Qt::AlignTop | Qt::TextWordWrap, placeholderText());
    }

    QAbstractTextDocumentLayout::PaintContext context = getPaintContext();
    painter.setPen(context.palette.text().color());

    while (block.isValid()) {

        QRectF r = blockBoundingRect(block).translated(offset);
        QTextLayout *layout = block.layout();

        if (!block.isVisible()) {
            offset.ry() += r.height();
            block = block.next();
            continue;
        }

        if (r.bottom() >= er.top() && r.top() <= er.bottom()) {

            QTextBlockFormat blockFormat = block.blockFormat();

            QBrush bg = blockFormat.background();
            if (bg != Qt::NoBrush) {
                QRectF contentsRect = r;
                contentsRect.setWidth(qMax(r.width(), maximumWidth));
                fillBackground(&painter, contentsRect, bg);
            }

            QList<QTextLayout::FormatRange> selections;
            int blpos = block.position();
            int bllen = block.length();
            for (int i = 0; i < context.selections.size(); ++i) {
                const QAbstractTextDocumentLayout::Selection &range = context.selections.at(i);
                const int selStart = range.cursor.selectionStart() - blpos;
                const int selEnd = range.cursor.selectionEnd() - blpos;
                if (selStart < bllen && selEnd > 0
                    && selEnd > selStart) {
                    QTextLayout::FormatRange o;
                    o.start = selStart;
                    o.length = selEnd - selStart;
                    o.format = range.format;
                    selections.append(o);
                } else if (!range.cursor.hasSelection() && range.format.hasProperty(QTextFormat::FullWidthSelection)
                           && block.contains(range.cursor.position())) {
                    // for full width selections we don't require an actual selection, just
                    // a position to specify the line. that's more convenience in usage.
                    QTextLayout::FormatRange o;
                    QTextLine l = layout->lineForTextPosition(range.cursor.position() - blpos);
                    o.start = l.textStart();
                    o.length = l.textLength();
                    if (o.start + o.length == bllen - 1)
                        ++o.length; // include newline
                    o.format = range.format;
                    selections.append(o);
                }
            }

            bool drawCursor = ((editable || (textInteractionFlags() & Qt::TextSelectableByKeyboard))
                               && context.cursorPosition >= blpos
                               && context.cursorPosition < blpos + bllen);

            bool drawCursorAsBlock = drawCursor && overwriteMode() ;

            if (drawCursorAsBlock) {
                if (context.cursorPosition == blpos + bllen - 1) {
                    drawCursorAsBlock = false;
                } else {
                    QTextLayout::FormatRange o;
                    o.start = context.cursorPosition - blpos;
                    o.length = 1;
                    o.format.setForeground(palette().base());
                    o.format.setBackground(palette().text());
                    selections.append(o);
                }
            }

            layout->draw(&painter, offset, selections, er);

            if ((drawCursor && !drawCursorAsBlock)
                || (editable && context.cursorPosition < -1
                    && !layout->preeditAreaText().isEmpty())) {
                int cpos = context.cursorPosition;
                if (cpos < -1)
                    cpos = layout->preeditAreaPosition() - (cpos + 2);
                else
                    cpos -= blpos;
                layout->drawCursor(&painter, offset, cpos, cursorWidth());
            }
        }

        offset.ry() += r.height();
        if (offset.y() > viewportRect.height())
            break;
        block = block.next();
    }

    if (backgroundVisible() && !block.isValid() && offset.y() <= er.bottom()
        && (centerOnScroll() || verticalScrollBar()->maximum() == verticalScrollBar()->minimum())) {
        painter.fillRect(QRect(QPoint((int)er.left(), (int)offset.y()), er.bottomRight()), palette().window());
    }
}